

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::begin_function_scope
          (CombinedImageSamplerHandler *this,uint32_t *args,uint32_t length)

{
  SPIRFunction *local_38;
  SPIRFunction *local_30;
  SPIRFunction *callee;
  uint32_t *puStack_20;
  uint32_t length_local;
  uint32_t *args_local;
  CombinedImageSamplerHandler *this_local;
  
  if (2 < length) {
    callee._4_4_ = length;
    puStack_20 = args;
    args_local = (uint32_t *)this;
    local_30 = get<spirv_cross::SPIRFunction>(this->compiler,args[2]);
    puStack_20 = puStack_20 + 3;
    callee._4_4_ = callee._4_4_ - 3;
    push_remap_parameters(this,local_30,puStack_20,callee._4_4_);
    local_38 = local_30;
    ::std::
    stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
    ::push(&this->functions,&local_38);
  }
  return 2 < length;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::begin_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	auto &callee = compiler.get<SPIRFunction>(args[2]);
	args += 3;
	length -= 3;
	push_remap_parameters(callee, args, length);
	functions.push(&callee);
	return true;
}